

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_ast_t * mpc_ast_traverse_next(mpc_ast_trav_t **trav)

{
  mpc_ast_trav_t *pmVar1;
  mpc_ast_t *pmVar2;
  mpc_ast_t *pmVar3;
  mpc_ast_trav_t *pmVar4;
  int iVar5;
  
  pmVar1 = *trav;
  if (pmVar1 != (mpc_ast_trav_t *)0x0) {
    if (pmVar1->order == mpc_ast_trav_order_post) {
      pmVar2 = pmVar1->curr_node;
      *trav = pmVar1->parent;
      free(pmVar1);
      pmVar1 = *trav;
      if (pmVar1 == (mpc_ast_trav_t *)0x0) {
        return pmVar2;
      }
      iVar5 = pmVar1->curr_child + 1;
      pmVar1->curr_child = iVar5;
      if (pmVar1->curr_node->children_num <= iVar5) {
        return pmVar2;
      }
      pmVar3 = (*trav)->curr_node;
      iVar5 = pmVar3->children_num;
      pmVar1 = *trav;
      while (0 < iVar5) {
        pmVar4 = (mpc_ast_trav_t *)malloc(0x18);
        pmVar4->curr_node = pmVar3->children[pmVar1->curr_child];
        pmVar4->parent = pmVar1;
        pmVar4->curr_child = 0;
        pmVar4->order = pmVar1->order;
        *trav = pmVar4;
        pmVar3 = pmVar4->curr_node;
        pmVar1 = pmVar4;
        iVar5 = pmVar3->children_num;
      }
      return pmVar2;
    }
    if (pmVar1->order == mpc_ast_trav_order_pre) {
      pmVar2 = pmVar1->curr_node;
      while( true ) {
        pmVar1 = *trav;
        if (pmVar1 == (mpc_ast_trav_t *)0x0) {
          return pmVar2;
        }
        if (pmVar1->curr_child < pmVar1->curr_node->children_num) break;
        *trav = pmVar1->parent;
        free(pmVar1);
      }
      if (pmVar1 == (mpc_ast_trav_t *)0x0) {
        return pmVar2;
      }
      pmVar4 = (mpc_ast_trav_t *)malloc(0x18);
      pmVar4->curr_node = pmVar1->curr_node->children[pmVar1->curr_child];
      pmVar4->parent = pmVar1;
      pmVar4->curr_child = 0;
      pmVar4->order = pmVar1->order;
      pmVar1->curr_child = pmVar1->curr_child + 1;
      *trav = pmVar4;
      return pmVar2;
    }
  }
  return (mpc_ast_t *)0x0;
}

Assistant:

mpc_ast_t *mpc_ast_traverse_next(mpc_ast_trav_t **trav) {
  mpc_ast_trav_t *n_trav, *to_free;
  mpc_ast_t *ret = NULL;
  int cchild;

  /* The end of traversal was reached */
  if(*trav == NULL) return NULL;

  switch((*trav)->order) {
    case mpc_ast_trav_order_pre:
      ret = (*trav)->curr_node;

      /* If there aren't any more children, go up */
      while(*trav != NULL &&
        (*trav)->curr_child >= (*trav)->curr_node->children_num)
      {
        to_free = *trav;
        *trav = (*trav)->parent;
        free(to_free);
      }

      /* If trav is NULL, the end was reached */
      if(*trav == NULL) {
        break;
      }

      /* Go to next child */
      n_trav = malloc(sizeof(mpc_ast_trav_t));

      cchild = (*trav)->curr_child;
      n_trav->curr_node = (*trav)->curr_node->children[cchild];
      n_trav->parent = *trav;
      n_trav->curr_child = 0;
      n_trav->order = (*trav)->order;

      (*trav)->curr_child++;
      *trav = n_trav;

      break;

    case mpc_ast_trav_order_post:
      ret = (*trav)->curr_node;

      /* Move up tree to the parent If the parent doesn't have any more nodes,
       * then this is the current node. If it does, move down to its left most
       * child. Also, free the previous traversal node */
      to_free = *trav;
      *trav = (*trav)->parent;
      free(to_free);

      if(*trav == NULL)
        break;

      /* Next child */
      (*trav)->curr_child++;

      /* If there aren't any more children, this is the next node */
      if((*trav)->curr_child >= (*trav)->curr_node->children_num) {
        break;
      }

      /* If there are still more children, find the leftmost child from this
       * node */
      while((*trav)->curr_node->children_num > 0) {
        n_trav = malloc(sizeof(mpc_ast_trav_t));

        cchild = (*trav)->curr_child;
        n_trav->curr_node = (*trav)->curr_node->children[cchild];
        n_trav->parent = *trav;
        n_trav->curr_child = 0;
        n_trav->order = (*trav)->order;

        *trav = n_trav;
      }

    default:
      /* Unreachable, but compiler complaints */
      break;
  }

  return ret;
}